

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::cleanup(HEkkDual *this,EVP_PKEY_CTX *ctx)

{
  HEkk *pHVar1;
  HEkk *unaff_retaddr;
  vector<double,_std::allocator<double>_> original_workDual;
  HighsSimplexInfo *info;
  bool excessive_cleanup_calls;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  bool in_stack_00000087;
  HighsInt in_stack_00000088;
  SimplexAlgorithm in_stack_0000008c;
  undefined7 in_stack_00000090;
  bool in_stack_00000097;
  HighsInt in_stack_00000098;
  SimplexAlgorithm in_stack_0000009c;
  HEkk *in_stack_000000a0;
  HEkk *in_stack_000001a0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  HighsInt in_stack_ffffffffffffffdc;
  HEkk *in_stack_ffffffffffffffe0;
  
  if ((this->solve_phase == 1) &&
     (this->ekk_instance_->dual_simplex_phase1_cleanup_level_ =
           this->ekk_instance_->dual_simplex_phase1_cleanup_level_ + 1,
     (this->ekk_instance_->options_->super_HighsOptionsStruct).max_dual_simplex_phase1_cleanup_level
     < this->ekk_instance_->dual_simplex_phase1_cleanup_level_)) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                "Dual simplex cleanup level has exceeded limit of %d\n",
                (ulong)(uint)(this->ekk_instance_->options_->super_HighsOptionsStruct).
                             max_dual_simplex_phase1_cleanup_level);
  }
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
              "dual-cleanup-shift\n");
  pHVar1 = this->ekk_instance_;
  HEkk::initialiseCost
            ((HEkk *)CONCAT17(in_stack_00000097,in_stack_00000090),in_stack_0000008c,
             in_stack_00000088,in_stack_00000087);
  (pHVar1->info_).allow_cost_perturbation = false;
  HEkk::initialiseBound(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000097);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x787b4f);
  if (1 < (this->ekk_instance_->options_->super_HighsOptionsStruct).highs_debug_level) {
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000060,in_stack_00000058);
  }
  HEkk::computeDual(in_stack_000001a0);
  HEkk::computeSimplexDualInfeasible(unaff_retaddr);
  this->dualInfeasCount = (this->ekk_instance_->info_).num_dual_infeasibilities;
  HEkk::computeDualObjectiveValue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  (pHVar1->info_).updated_dual_objective_value = (pHVar1->info_).dual_objective_value;
  if (((pHVar1->info_).run_quiet & 1U) == 0) {
    HEkk::computeSimplexPrimalInfeasible((HEkk *)info);
    if (this->solve_phase == 1) {
      HEkk::computeSimplexLpDualInfeasible((HEkk *)info);
    }
    reportRebuild((HEkkDual *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void HEkkDual::cleanup() {
  if (solve_phase == kSolvePhase1) {
    // Take action to prevent infinite loop. Shouldn't get to this
    // stage, since cost perturbation isn't permitted unless the dual
    // simplex phase 1 cleanup level is less than the limit
    ekk_instance_.dual_simplex_phase1_cleanup_level_++;
    const bool excessive_cleanup_calls =
        ekk_instance_.dual_simplex_phase1_cleanup_level_ >
        ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level;
    if (excessive_cleanup_calls) {
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kError,
          "Dual simplex cleanup level has exceeded limit of %d\n",
          (int)ekk_instance_.options_->max_dual_simplex_phase1_cleanup_level);
      assert(!excessive_cleanup_calls);
    }
  }
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "dual-cleanup-shift\n");
  HighsSimplexInfo& info = ekk_instance_.info_;
  // Remove perturbation and don't permit further perturbation
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown);
  info.allow_cost_perturbation = false;
  // No solve_phase term in initialiseBound is surely an omission -
  // when cleanup called in phase 1
  ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
  // Possibly take a copy of the original duals before recomputing them
  vector<double> original_workDual;
  if (ekk_instance_.options_->highs_debug_level > kHighsDebugLevelCheap)
    original_workDual = info.workDual_;
  // Compute the dual values
  ekk_instance_.computeDual();
  // Possibly analyse the change in duals
  //  debugCleanup(ekk_instance_, original_workDual);
  // Compute the dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  dualInfeasCount = ekk_instance_.info_.num_dual_infeasibilities;

  // Compute the dual objective value
  ekk_instance_.computeDualObjectiveValue(solve_phase);
  // Now that there's a new dual_objective_value, reset the updated
  // value
  info.updated_dual_objective_value = info.dual_objective_value;

  if (!info.run_quiet) {
    // Report the primal infeasibilities
    ekk_instance_.computeSimplexPrimalInfeasible();
    // In phase 1, report the simplex LP dual infeasibilities
    // In phase 2, report the simplex dual infeasibilities (known)
    if (solve_phase == kSolvePhase1)
      ekk_instance_.computeSimplexLpDualInfeasible();
    reportRebuild(kRebuildReasonCleanup);
  }
}